

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.hh
# Opt level: O2

void __thiscall kratos::Attribute::~Attribute(Attribute *this)

{
  this->_vptr_Attribute = (_func_int **)&PTR__Attribute_002b7dc8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->target_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&this->value_str);
  std::__cxx11::string::~string((string *)&this->type_str);
  return;
}

Assistant:

virtual ~Attribute() = default;